

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

void QUndoStackPrivate::setPrefixedText
               (QAction *action,QString *prefix,QString *defaultText,QString *text)

{
  long lVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((defaultText->d).size == 0) {
    local_38.d.d = (prefix->d).d;
    local_38.d.ptr = (prefix->d).ptr;
    local_38.d.size = (prefix->d).size;
    lVar1 = local_38.d.size;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar1 = (prefix->d).size;
    }
    if ((lVar1 != 0) && ((text->d).size != 0)) {
      QString::append((QChar)(char16_t)&local_38);
    }
    QString::append((QString *)&local_38);
    QAction::setText(action,&local_38);
  }
  else {
    lVar1 = (text->d).size;
    if (lVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QAction::setText(action,defaultText);
        return;
      }
      goto LAB_006042bb;
    }
    QVar2.m_size = (size_t)prefix;
    QVar2.field_0.m_data = &local_38;
    QString::arg_impl(QVar2,(int)(text->d).ptr,(QChar)(char16_t)lVar1);
    QAction::setText(action,&local_38);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_006042bb:
  __stack_chk_fail();
}

Assistant:

void QUndoStackPrivate::setPrefixedText(QAction *action, const QString &prefix, const QString &defaultText, const QString &text)
{
    if (defaultText.isEmpty()) {
        QString s = prefix;
        if (!prefix.isEmpty() && !text.isEmpty())
            s.append(u' ');
        s.append(text);
        action->setText(s);
    } else {
        if (text.isEmpty())
            action->setText(defaultText);
        else
            action->setText(prefix.arg(text));
    }
}